

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim.cpp
# Opt level: O1

string_t __thiscall
duckdb::TrimOperator<false,true>::Operation<duckdb::string_t,duckdb::string_t>
          (TrimOperator<false,true> *this,string_t input,Vector *result)

{
  utf8proc_category_t uVar1;
  utf8proc_ssize_t uVar2;
  ulong uVar3;
  StringVector *extraout_RDX;
  StringVector *len;
  void *__src;
  Vector *pVVar4;
  undefined1 *__dest;
  Vector *pVVar5;
  Vector *vector;
  utf8proc_int32_t codepoint;
  string_t target;
  utf8proc_int32_t local_54;
  undefined1 local_50 [16];
  undefined8 local_40;
  void *local_38;
  
  local_38 = input.value._0_8_;
  __src = local_38;
  if (((ulong)this & 0xffffffff) < 0xd) {
    __src = (void *)((long)&local_40 + 4);
  }
  vector = (Vector *)0x0;
  pVVar5 = (Vector *)((ulong)this & 0xffffffff);
  len = input.value._8_8_;
  local_40 = this;
  if (pVVar5 != (Vector *)0x0) {
    pVVar4 = (Vector *)0x0;
    do {
      uVar2 = utf8proc_iterate((utf8proc_uint8_t *)((long)__src + (long)pVVar4),
                               (long)pVVar5 - (long)pVVar4,&local_54);
      pVVar4 = (Vector *)(&pVVar4->vector_type + uVar2);
      uVar1 = utf8proc_category(local_54);
      if (uVar1 != UTF8PROC_CATEGORY_ZS) {
        vector = pVVar4;
      }
      len = extraout_RDX;
    } while (pVVar4 < pVVar5);
  }
  local_50 = (undefined1  [16])StringVector::EmptyString(input.value._8_8_,vector,(idx_t)len);
  __dest = local_50._8_8_;
  if (local_50._0_4_ < 0xd) {
    __dest = local_50 + 4;
  }
  switchD_015ff80e::default(__dest,__src,(size_t)vector);
  uVar3 = (ulong)(uint)local_50._0_4_;
  if (uVar3 < 0xd) {
    switchD_0105b559::default(local_50 + 4 + uVar3,0,0xc - uVar3);
  }
  else {
    local_50._4_4_ = *(undefined4 *)local_50._8_8_;
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_50;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto data = input.GetData();
		auto size = input.GetSize();

		utf8proc_int32_t codepoint;
		auto str = reinterpret_cast<const utf8proc_uint8_t *>(data);

		// Find the first character that is not left trimmed
		idx_t begin = 0;
		if (LTRIM) {
			while (begin < size) {
				auto bytes =
				    utf8proc_iterate(str + begin, UnsafeNumericCast<utf8proc_ssize_t>(size - begin), &codepoint);
				D_ASSERT(bytes > 0);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					break;
				}
				begin += UnsafeNumericCast<idx_t>(bytes);
			}
		}

		// Find the last character that is not right trimmed
		idx_t end;
		if (RTRIM) {
			end = begin;
			for (auto next = begin; next < size;) {
				auto bytes = utf8proc_iterate(str + next, UnsafeNumericCast<utf8proc_ssize_t>(size - next), &codepoint);
				D_ASSERT(bytes > 0);
				next += UnsafeNumericCast<idx_t>(bytes);
				if (utf8proc_category(codepoint) != UTF8PROC_CATEGORY_ZS) {
					end = next;
				}
			}
		} else {
			end = size;
		}

		// Copy the trimmed string
		auto target = StringVector::EmptyString(result, end - begin);
		auto output = target.GetDataWriteable();
		memcpy(output, data + begin, end - begin);

		target.Finalize();
		return target;
	}